

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferingScanTarget.cpp
# Opt level: O3

void __thiscall Outputs::Display::BufferingScanTarget::end_scan(BufferingScanTarget *this)

{
  uint16_t *puVar1;
  uint uVar2;
  Scan *pSVar3;
  int iVar4;
  ushort uVar5;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->producer_mutex_);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  if (this->scan_is_ongoing_ != false) {
    this->scan_is_ongoing_ = false;
    pSVar3 = this->vended_scan_;
    if (pSVar3 != (Scan *)0x0) {
      uVar2 = this->vended_write_area_pointer_;
      pSVar3->data_y = (uint16_t)(uVar2 >> 0xb);
      pSVar3->line = (this->write_pointers_).line;
      uVar5 = (ushort)uVar2 & 0x7ff;
      puVar1 = &(pSVar3->scan).end_points[0].data_offset;
      *puVar1 = *puVar1 + uVar5;
      puVar1 = &(pSVar3->scan).end_points[1].data_offset;
      *puVar1 = *puVar1 + uVar5;
      this->vended_scan_ = (Scan *)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->producer_mutex_);
    return;
  }
  __assert_fail("scan_is_ongoing_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/ScanTargets/BufferingScanTarget.cpp"
                ,0xaf,"virtual void Outputs::Display::BufferingScanTarget::end_scan()");
}

Assistant:

void BufferingScanTarget::end_scan() {
	std::lock_guard lock_guard(producer_mutex_);

#ifndef NDEBUG
	assert(scan_is_ongoing_);
	scan_is_ongoing_ = false;
#endif

	// Complete the scan only if one is afoot.
	if(vended_scan_) {
		vended_scan_->data_y = TextureAddressGetY(vended_write_area_pointer_);
		vended_scan_->line = write_pointers_.line;
		vended_scan_->scan.end_points[0].data_offset += TextureAddressGetX(vended_write_area_pointer_);
		vended_scan_->scan.end_points[1].data_offset += TextureAddressGetX(vended_write_area_pointer_);
		vended_scan_ = nullptr;
	}
}